

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase105::run(TestCase105 *this)

{
  bool bVar1;
  Reader value;
  Reader value_00;
  StructReader local_218;
  Fault f;
  ArrayPtr<const_char> local_1b8;
  Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> orphan;
  Fault f_2;
  Builder root;
  uint local_12c;
  Builder list;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&root,&builder.super_MessageBuilder);
  capnproto_test::capnp::test::TestAllTypes::Builder::initStructList(&list,&root,2);
  ListBuilder::getStructElement((StructBuilder *)&local_218,&list.builder,0);
  value.super_StringPtr.content.size_ = 4;
  value.super_StringPtr.content.ptr = "foo";
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextField((Builder *)&local_218,value);
  ListBuilder::getStructElement((StructBuilder *)&local_218,&list.builder,1);
  value_00.super_StringPtr.content.size_ = 4;
  value_00.super_StringPtr.content.ptr = "bar";
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextField((Builder *)&local_218,value_00);
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasStructList(&root);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x70,ERROR,"\"failed: expected \" \"root.hasStructList()\"",
               (char (*) [38])"failed: expected root.hasStructList()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::disownStructList(&orphan,&root);
  if ((orphan.builder.location == (word *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x73,ERROR,"\"failed: expected \" \"!(orphan == nullptr)\"",
               (char (*) [38])"failed: expected !(orphan == nullptr)");
  }
  OrphanGetImpl<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>,_(capnp::Kind)6>
  ::applyReader((Reader *)&local_218,&orphan.builder);
  if ((uint)local_218.pointers != 2) {
    f_2.exception._0_4_ = 2;
    OrphanGetImpl<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>,_(capnp::Kind)6>
    ::applyReader((Reader *)&local_218,&orphan.builder);
    local_1b8.ptr._0_4_ = (uint)local_218.pointers;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x75,FAILED,"(2u) == (orphan.getReader().size())","2u, orphan.getReader().size()",
               (uint *)&f_2,(uint *)&local_1b8);
    kj::_::Debug::Fault::fatal(&f);
  }
  OrphanGetImpl<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>,_(capnp::Kind)6>
  ::applyReader((Reader *)&f,&orphan.builder);
  ListReader::getStructElement(&local_218,(ListReader *)&f,0);
  _f_2 = (ArrayPtr<const_char>)
         capnproto_test::capnp::test::TestAllTypes::Reader::getTextField((Reader *)&local_218);
  bVar1 = kj::operator==("foo",(StringPtr *)&f_2);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    OrphanGetImpl<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>,_(capnp::Kind)6>
    ::applyReader((Reader *)&f,&orphan.builder);
    ListReader::getStructElement(&local_218,(ListReader *)&f,0);
    _f_2 = (ArrayPtr<const_char>)
           capnproto_test::capnp::test::TestAllTypes::Reader::getTextField((Reader *)&local_218);
    kj::_::Debug::log<char_const(&)[67],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x76,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (orphan.getReader()[0].getTextField())\", \"foo\", orphan.getReader()[0].getTextField()"
               ,(char (*) [67])
                "failed: expected (\"foo\") == (orphan.getReader()[0].getTextField())",
               (char (*) [4])"foo",(Reader *)&f_2);
  }
  OrphanGetImpl<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>,_(capnp::Kind)6>
  ::applyReader((Reader *)&f,&orphan.builder);
  ListReader::getStructElement(&local_218,(ListReader *)&f,1);
  _f_2 = (ArrayPtr<const_char>)
         capnproto_test::capnp::test::TestAllTypes::Reader::getTextField((Reader *)&local_218);
  bVar1 = kj::operator==("bar",(StringPtr *)&f_2);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    OrphanGetImpl<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>,_(capnp::Kind)6>
    ::applyReader((Reader *)&f,&orphan.builder);
    ListReader::getStructElement(&local_218,(ListReader *)&f,1);
    _f_2 = (ArrayPtr<const_char>)
           capnproto_test::capnp::test::TestAllTypes::Reader::getTextField((Reader *)&local_218);
    kj::_::Debug::log<char_const(&)[67],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x77,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (orphan.getReader()[1].getTextField())\", \"bar\", orphan.getReader()[1].getTextField()"
               ,(char (*) [67])
                "failed: expected (\"bar\") == (orphan.getReader()[1].getTextField())",
               (char (*) [4])0x2c587e,(Reader *)&f_2);
  }
  OrphanGetImpl<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>,_(capnp::Kind)6>
  ::apply((Builder *)&local_218,&orphan.builder);
  if ((uint)local_218.pointers != 2) {
    f_2.exception._0_4_ = 2;
    OrphanGetImpl<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>,_(capnp::Kind)6>
    ::apply((Builder *)&local_218,&orphan.builder);
    local_1b8.ptr._0_4_ = (uint)local_218.pointers;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x78,FAILED,"(2u) == (orphan.get().size())","2u, orphan.get().size()",(uint *)&f_2,
               (uint *)&local_1b8);
    kj::_::Debug::Fault::fatal(&f);
  }
  OrphanGetImpl<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>,_(capnp::Kind)6>
  ::apply((Builder *)&f,&orphan.builder);
  ListBuilder::getStructElement((StructBuilder *)&local_218,(ListBuilder *)&f,0);
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
            ((Builder *)&f_2,(Builder *)&local_218);
  bVar1 = operator==("foo",(Builder *)&f_2);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    OrphanGetImpl<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>,_(capnp::Kind)6>
    ::apply((Builder *)&f,&orphan.builder);
    ListBuilder::getStructElement((StructBuilder *)&local_218,(ListBuilder *)&f,0);
    capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
              ((Builder *)&f_2,(Builder *)&local_218);
    kj::_::Debug::log<char_const(&)[61],char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x79,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (orphan.get()[0].getTextField())\", \"foo\", orphan.get()[0].getTextField()"
               ,(char (*) [61])"failed: expected (\"foo\") == (orphan.get()[0].getTextField())",
               (char (*) [4])"foo",(Builder *)&f_2);
  }
  OrphanGetImpl<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>,_(capnp::Kind)6>
  ::apply((Builder *)&f,&orphan.builder);
  ListBuilder::getStructElement((StructBuilder *)&local_218,(ListBuilder *)&f,1);
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
            ((Builder *)&f_2,(Builder *)&local_218);
  bVar1 = operator==("bar",(Builder *)&f_2);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    OrphanGetImpl<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>,_(capnp::Kind)6>
    ::apply((Builder *)&f,&orphan.builder);
    ListBuilder::getStructElement((StructBuilder *)&local_218,(ListBuilder *)&f,1);
    capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
              ((Builder *)&f_2,(Builder *)&local_218);
    kj::_::Debug::log<char_const(&)[61],char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x7a,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (orphan.get()[1].getTextField())\", \"bar\", orphan.get()[1].getTextField()"
               ,(char (*) [61])"failed: expected (\"bar\") == (orphan.get()[1].getTextField())",
               (char (*) [4])0x2c587e,(Builder *)&f_2);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasStructList(&root);
  if (bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x7b,ERROR,"\"failed: expected \" \"!(root.hasStructList())\"",
               (char (*) [41])"failed: expected !(root.hasStructList())");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::adoptStructList(&root,&orphan);
  if ((orphan.builder.location != (word *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[35]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x7e,ERROR,"\"failed: expected \" \"orphan == nullptr\"",
               (char (*) [35])"failed: expected orphan == nullptr");
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasStructList(&root);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x7f,ERROR,"\"failed: expected \" \"root.hasStructList()\"",
               (char (*) [38])"failed: expected root.hasStructList()");
  }
  StructBuilder::asReader(&root._builder);
  capnproto_test::capnp::test::TestAllTypes::Reader::getStructList
            ((Reader *)&local_218,(Reader *)&f);
  if ((uint)local_218.pointers == 2) {
    StructBuilder::asReader(&root._builder);
    capnproto_test::capnp::test::TestAllTypes::Reader::getStructList((Reader *)&f,(Reader *)&f_2);
    ListReader::getStructElement(&local_218,(ListReader *)&f,0);
    local_1b8 = (ArrayPtr<const_char>)
                capnproto_test::capnp::test::TestAllTypes::Reader::getTextField
                          ((Reader *)&local_218);
    bVar1 = kj::operator==("foo",(StringPtr *)&local_1b8);
    if (!bVar1 && kj::_::Debug::minSeverity < 3) {
      StructBuilder::asReader(&root._builder);
      capnproto_test::capnp::test::TestAllTypes::Reader::getStructList((Reader *)&f,(Reader *)&f_2);
      ListReader::getStructElement(&local_218,(ListReader *)&f,0);
      local_1b8 = (ArrayPtr<const_char>)
                  capnproto_test::capnp::test::TestAllTypes::Reader::getTextField
                            ((Reader *)&local_218);
      kj::_::Debug::log<char_const(&)[80],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x81,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (root.asReader().getStructList()[0].getTextField())\", \"foo\", root.asReader().getStructList()[0].getTextField()"
                 ,(char (*) [80])
                  "failed: expected (\"foo\") == (root.asReader().getStructList()[0].getTextField())"
                 ,(char (*) [4])"foo",(Reader *)&local_1b8);
    }
    StructBuilder::asReader(&root._builder);
    capnproto_test::capnp::test::TestAllTypes::Reader::getStructList((Reader *)&f,(Reader *)&f_2);
    ListReader::getStructElement(&local_218,(ListReader *)&f,1);
    local_1b8 = (ArrayPtr<const_char>)
                capnproto_test::capnp::test::TestAllTypes::Reader::getTextField
                          ((Reader *)&local_218);
    bVar1 = kj::operator==("bar",(StringPtr *)&local_1b8);
    if (!bVar1 && kj::_::Debug::minSeverity < 3) {
      StructBuilder::asReader(&root._builder);
      capnproto_test::capnp::test::TestAllTypes::Reader::getStructList((Reader *)&f,(Reader *)&f_2);
      ListReader::getStructElement(&local_218,(ListReader *)&f,1);
      local_1b8 = (ArrayPtr<const_char>)
                  capnproto_test::capnp::test::TestAllTypes::Reader::getTextField
                            ((Reader *)&local_218);
      kj::_::Debug::log<char_const(&)[80],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x82,ERROR,
                 "\"failed: expected \" \"(\\\"bar\\\") == (root.asReader().getStructList()[1].getTextField())\", \"bar\", root.asReader().getStructList()[1].getTextField()"
                 ,(char (*) [80])
                  "failed: expected (\"bar\") == (root.asReader().getStructList()[1].getTextField())"
                 ,(char (*) [4])0x2c587e,(Reader *)&local_1b8);
    }
    OrphanBuilder::~OrphanBuilder(&orphan.builder);
    MallocMessageBuilder::~MallocMessageBuilder(&builder);
    return;
  }
  local_1b8.ptr._0_4_ = 2;
  StructBuilder::asReader(&root._builder);
  capnproto_test::capnp::test::TestAllTypes::Reader::getStructList
            ((Reader *)&local_218,(Reader *)&f);
  local_12c = (uint)local_218.pointers;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
            (&f_2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
             ,0x80,FAILED,"(2u) == (root.asReader().getStructList().size())",
             "2u, root.asReader().getStructList().size()",(uint *)&local_1b8,&local_12c);
  kj::_::Debug::Fault::fatal(&f_2);
}

Assistant:

TEST(Orphans, StructLists) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestAllTypes>();

  auto list = root.initStructList(2);
  list[0].setTextField("foo");
  list[1].setTextField("bar");
  EXPECT_TRUE(root.hasStructList());

  Orphan<List<TestAllTypes>> orphan = root.disownStructList();
  EXPECT_FALSE(orphan == nullptr);

  ASSERT_EQ(2u, orphan.getReader().size());
  EXPECT_EQ("foo", orphan.getReader()[0].getTextField());
  EXPECT_EQ("bar", orphan.getReader()[1].getTextField());
  ASSERT_EQ(2u, orphan.get().size());
  EXPECT_EQ("foo", orphan.get()[0].getTextField());
  EXPECT_EQ("bar", orphan.get()[1].getTextField());
  EXPECT_FALSE(root.hasStructList());

  root.adoptStructList(kj::mv(orphan));
  EXPECT_TRUE(orphan == nullptr);
  EXPECT_TRUE(root.hasStructList());
  ASSERT_EQ(2u, root.asReader().getStructList().size());
  EXPECT_EQ("foo", root.asReader().getStructList()[0].getTextField());
  EXPECT_EQ("bar", root.asReader().getStructList()[1].getTextField());
}